

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# murmur_hash.hxx
# Opt level: O2

uint32_t murmur_hash(void *key,uint32_t length,uint32_t seed)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint i;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = (ulong)(length & 0xfffffffc);
  for (uVar4 = 0; length >> 2 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = *(int *)((long)key + uVar4 * 4);
    uVar5 = ((uint)(iVar1 * -0x3361d2af) >> 0x11 | iVar1 * 0x16a88000) * 0x1b873593 ^ seed;
    seed = (uVar5 << 0xd | uVar5 >> 0x13) * 5 + 0xe6546b64;
  }
  uVar5 = 0;
  uVar3 = 0;
  switch(length & 3) {
  case 3:
    uVar3 = (uint)*(byte *)((long)key + uVar2 + 2) << 0x10;
  case 2:
    uVar5 = uVar3 | (uint)*(byte *)((long)key + uVar2 + 1) << 8;
  case 1:
    uVar5 = *(byte *)((long)key + uVar2) ^ uVar5;
    seed = seed ^ (uVar5 * -0x3361d2af >> 0x11 | uVar5 * 0x16a88000) * 0x1b873593;
  case 0:
    uVar5 = ((seed ^ length) >> 0x10 ^ seed ^ length) * -0x7a143595;
    uVar5 = (uVar5 >> 0xd ^ uVar5) * -0x3d4d51cb;
    return uVar5 >> 0x10 ^ uVar5;
  }
}

Assistant:

HLL_CONSTEXPR_OR_INLINE uint32_t murmur_hash(const void* key, uint32_t length, uint32_t seed) noexcept
{
    constexpr uint32_t c1 = 0xcc9e2d51;
    constexpr uint32_t c2 = 0x1b873593;
    constexpr uint32_t r1 = 15;
    constexpr uint32_t r2 = 13;
    constexpr uint32_t m = 5;
    constexpr uint32_t n = 0xe6546b64;
    const auto chunk_length = length / 4u;
    const auto chunks = static_cast<const uint32_t*>(key); // 32 bit extract from `key'
    const auto tail = static_cast<const uint8_t*>(key) + chunk_length * 4; // tail - last 8 bytes
    uint32_t h = 0;
    uint32_t k = 0;

    h = seed;

    // for each 4 byte chunk of `key'
    for (auto i = 0u; i < chunk_length; ++i)
    {
        // next 4 byte chunk of `key'
        k = chunks[i];

        // encode next 4 byte chunk of `key'
        k *= c1;
        k = (k << r1) | (k >> (32 - r1));
        k *= c2;

        // append to hash
        h ^= k;
        h = (h << r2) | (h >> (32 - r2));
        h = h * m + n;
    }

    k = 0;

    // remainder
    switch (length & 3u)
    { // `length % 4'
        case 3:
            k ^= (tail[2] << 16u);
        case 2:
            k ^= (tail[1] << 8u);

        case 1:
            k ^= tail[0];
            k *= c1;
            k = (k << r1) | (k >> (32 - r1));
            k *= c2;
            h ^= k;
    }

    h ^= length;

    h ^= (h >> 16u);
    h *= 0x85ebca6b;
    h ^= (h >> 13u);
    h *= 0xc2b2ae35;
    h ^= (h >> 16u);

    return h;
}